

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O0

void VP8LBundleColorMap_C(uint8_t *row,int width,int xbits,uint32_t *dst)

{
  byte bVar1;
  uint uVar2;
  int xsub;
  uint32_t code;
  int mask;
  int bit_depth;
  int x;
  uint32_t *dst_local;
  int xbits_local;
  int width_local;
  uint8_t *row_local;
  
  if (xbits < 1) {
    for (x = 0; x < width; x = x + 1) {
      dst[x] = (uint)row[x] << 8 | 0xff000000;
    }
  }
  else {
    bVar1 = (byte)xbits;
    code = 0xff000000;
    for (x = 0; x < width; x = x + 1) {
      uVar2 = x & (1 << (bVar1 & 0x1f)) - 1U;
      if (uVar2 == 0) {
        code = 0xff000000;
      }
      code = (uint)row[x] << ((char)(1 << (3 - bVar1 & 0x1f)) * (char)uVar2 + 8U & 0x1f) | code;
      dst[x >> (bVar1 & 0x1f)] = code;
    }
  }
  return;
}

Assistant:

void VP8LBundleColorMap_C(const uint8_t* const row, int width, int xbits,
                          uint32_t* dst) {
  int x;
  if (xbits > 0) {
    const int bit_depth = 1 << (3 - xbits);
    const int mask = (1 << xbits) - 1;
    uint32_t code = 0xff000000;
    for (x = 0; x < width; ++x) {
      const int xsub = x & mask;
      if (xsub == 0) {
        code = 0xff000000;
      }
      code |= row[x] << (8 + bit_depth * xsub);
      dst[x >> xbits] = code;
    }
  } else {
    for (x = 0; x < width; ++x) dst[x] = 0xff000000 | (row[x] << 8);
  }
}